

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

void __thiscall embree::SceneGraph::QuadLight::QuadLight(QuadLight *this,QuadLight *param_2)

{
  undefined8 uVar1;
  
  (this->super_Light).type = (param_2->super_Light).type;
  uVar1 = *(undefined8 *)((long)&(param_2->v0).field_0 + 8);
  *(undefined8 *)&(this->v0).field_0 = *(undefined8 *)&(param_2->v0).field_0;
  *(undefined8 *)((long)&(this->v0).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_2->v1).field_0 + 8);
  *(undefined8 *)&(this->v1).field_0 = *(undefined8 *)&(param_2->v1).field_0;
  *(undefined8 *)((long)&(this->v1).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_2->v2).field_0 + 8);
  *(undefined8 *)&(this->v2).field_0 = *(undefined8 *)&(param_2->v2).field_0;
  *(undefined8 *)((long)&(this->v2).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_2->v3).field_0 + 8);
  *(undefined8 *)&(this->v3).field_0 = *(undefined8 *)&(param_2->v3).field_0;
  *(undefined8 *)((long)&(this->v3).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_2->L).field_0 + 8);
  *(undefined8 *)&(this->L).field_0 = *(undefined8 *)&(param_2->L).field_0;
  *(undefined8 *)((long)&(this->L).field_0 + 8) = uVar1;
  return;
}

Assistant:

QuadLight (const Vec3fa& v0, const Vec3fa& v1, const Vec3fa& v2, const Vec3fa& v3, const Vec3fa& L)
        : Light(LIGHT_QUAD), v0(v0), v1(v1), v2(v2), v3(v3), L(L) {}